

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O2

lc_funcdefs * funcdef_defined(lc_funcdefs *f,char *name,int casesense)

{
  int iVar1;
  
  while( true ) {
    if (f == (lc_funcdefs *)0x0) {
      return (lc_funcdefs *)0x0;
    }
    if (casesense == 0) {
      iVar1 = strcasecmp(name,f->name);
    }
    else {
      iVar1 = strcmp(name,f->name);
    }
    if (iVar1 == 0) break;
    f = f->next;
  }
  return f;
}

Assistant:

struct lc_funcdefs *funcdef_defined(struct lc_funcdefs *f, const char *name,
				    int casesense)
{
	while (f) {
	    if (casesense) {
		if (!strcmp(name, f->name)) return f;
	    } else {
		if (!strcasecmp(name, f->name)) return f;
	    }
	    f = f->next;
	}
	return NULL;
}